

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O1

vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
* get_primes<libdivide::divider<short,(libdivide::Branching)1>,short>
            (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
             *__return_storage_ptr__,short max)

{
  pointer *ppdVar1;
  iterator __position;
  pointer pdVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  undefined8 extraout_RAX;
  size_t j;
  ulong uVar7;
  undefined6 in_register_00000032;
  ushort uVar8;
  ulong uVar9;
  vector<char,_std::allocator<char>_> sieve;
  divider<short,_(libdivide::Branching)1> local_44;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  uVar9 = (ulong)(int)CONCAT62(in_register_00000032,max);
  local_44.div.denom.magic = CONCAT11(local_44.div.denom.magic._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_40,uVar9 + 1,(value_type *)&local_44,&local_41);
  if (3 < (ushort)max) {
    lVar6 = 2;
    uVar7 = 4;
    do {
      if (uVar7 <= uVar9 &&
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] != '\0') {
        do {
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = '\0';
          uVar7 = uVar7 + lVar6;
        } while (uVar7 <= uVar9);
      }
      lVar6 = lVar6 + 1;
      uVar7 = lVar6 * lVar6;
    } while (uVar7 < uVar9 || uVar7 - uVar9 == 0);
  }
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < (ushort)max) {
    uVar7 = 2;
    do {
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] != '\0') {
        uVar8 = (ushort)uVar7;
        if (uVar8 == 0) {
          get_primes<libdivide::divider<short,(libdivide::Branching)1>,short>();
          pdVar2 = (__return_storage_ptr__->
                   super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pdVar2 != (pointer)0x0) {
            operator_delete(pdVar2);
          }
          if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(extraout_RAX);
        }
        uVar5 = -uVar8;
        if (0 < (short)uVar8) {
          uVar5 = uVar8;
        }
        local_44.div.denom.more = (uint8_t)(LZCOUNT(uVar5) ^ 0xfU);
        if ((uVar5 - 1 & uVar5) == 0) {
          local_44.div.denom.more = local_44.div.denom.more | (byte)(uVar7 >> 8) & 0x80;
          local_44.div.denom.magic = 0;
        }
        else {
          sVar4 = (short)((uint)(0x8000 << (LZCOUNT(uVar5) ^ 0xfU)) / (uint)uVar5);
          sVar3 = uVar5 * sVar4;
          local_44.div.denom.magic = (0 < sVar3 || uVar5 <= (ushort)(sVar3 * -2)) + 1 + sVar4 * 2;
          local_44.div.denom.more = ((-1 < (short)uVar8) << 7 | local_44.div.denom.more) - 0x40;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>
          ::_M_realloc_insert<libdivide::divider<short,(libdivide::Branching)1>>
                    ((vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>
                      *)__return_storage_ptr__,__position,&local_44);
        }
        else {
          ((__position._M_current)->div).denom.more = local_44.div.denom.more;
          ((__position._M_current)->div).denom.magic = local_44.div.denom.magic;
          ppdVar1 = &(__return_storage_ptr__->
                     super__Vector_base<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppdVar1 = *ppdVar1 + 1;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 <= uVar9);
  }
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}